

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline_opaque_pass.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::InlineOpaquePass::HasOpaqueArgsOrReturn(InlineOpaquePass *this,Instruction *callInst)

{
  Instruction *this_00;
  bool bVar1;
  uint32_t typeId;
  anon_class_16_2_3f4902d7 local_58;
  function<bool_(const_unsigned_int_*)> local_48;
  int local_24;
  Instruction *pIStack_20;
  int icnt;
  Instruction *callInst_local;
  InlineOpaquePass *this_local;
  
  pIStack_20 = callInst;
  callInst_local = (Instruction *)this;
  typeId = Instruction::type_id(callInst);
  bVar1 = IsOpaqueType(this,typeId);
  this_00 = pIStack_20;
  if (bVar1) {
    this_local._7_1_ = 1;
  }
  else {
    local_24 = 0;
    local_58.icnt = &local_24;
    local_58.this = this;
    std::function<bool(unsigned_int_const*)>::
    function<spvtools::opt::InlineOpaquePass::HasOpaqueArgsOrReturn(spvtools::opt::Instruction_const*)::__0,void>
              ((function<bool(unsigned_int_const*)> *)&local_48,&local_58);
    bVar1 = Instruction::WhileEachInId(this_00,&local_48);
    this_local._7_1_ = (bVar1 ^ 0xffU) & 1;
    std::function<bool_(const_unsigned_int_*)>::~function(&local_48);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool InlineOpaquePass::HasOpaqueArgsOrReturn(const Instruction* callInst) {
  // Check return type
  if (IsOpaqueType(callInst->type_id())) return true;
  // Check args
  int icnt = 0;
  return !callInst->WhileEachInId([&icnt, this](const uint32_t* iid) {
    if (icnt > 0) {
      const Instruction* argInst = get_def_use_mgr()->GetDef(*iid);
      if (IsOpaqueType(argInst->type_id())) return false;
    }
    ++icnt;
    return true;
  });
}